

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_print.c
# Opt level: O0

void easm_print_sinsn(FILE *out,envy_colors *cols,easm_sinsn *sinsn)

{
  int local_24;
  int i;
  easm_sinsn *sinsn_local;
  envy_colors *cols_local;
  FILE *out_local;
  
  if (sinsn->isunk == 0) {
    fprintf((FILE *)out,"%s%s%s",cols->iname,sinsn->str,cols->reset);
  }
  else {
    fprintf((FILE *)out,"%s%s%s",cols->err,sinsn->str,cols->reset);
  }
  for (local_24 = 0; local_24 < sinsn->operandsnum; local_24 = local_24 + 1) {
    easm_print_operand(out,cols,sinsn->operands[local_24]);
  }
  easm_print_mods(out,cols,sinsn->mods,0);
  return;
}

Assistant:

void easm_print_sinsn(FILE *out, const struct envy_colors *cols, struct easm_sinsn *sinsn) {
	int i;
	if (sinsn->isunk)
		fprintf(out, "%s%s%s", cols->err, sinsn->str, cols->reset);
	else
		fprintf(out, "%s%s%s", cols->iname, sinsn->str, cols->reset);
	for (i = 0; i < sinsn->operandsnum; i++) {
		easm_print_operand(out, cols, sinsn->operands[i]);
	}
	easm_print_mods(out, cols, sinsn->mods, 0);
}